

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# device.cc
# Opt level: O0

uint64_t __thiscall rcg::Device::getTimestampFrequency(Device *this)

{
  element_type *peVar1;
  element_type *peVar2;
  void *pvVar3;
  char *pcVar4;
  long in_RDI;
  size_t size;
  uint64_t freq;
  INFO_DATATYPE type;
  lock_guard<std::mutex> lock;
  Device *in_stack_ffffffffffffff88;
  lock_guard<std::mutex> *in_stack_ffffffffffffff90;
  PIFGetDeviceInfo p_Var5;
  size_t local_28;
  uint64_t local_20;
  INFO_DATATYPE local_14 [5];
  
  std::lock_guard<std::mutex>::lock_guard
            (in_stack_ffffffffffffff90,(mutex_type *)in_stack_ffffffffffffff88);
  local_20 = 0;
  local_28 = 8;
  if (*(long *)(in_RDI + 0x80) == 0) {
    peVar2 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x14a8b1);
    pvVar3 = Interface::getHandle(peVar2);
    if (pvVar3 != (void *)0x0) {
      peVar1 = std::
               __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
               ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)0x14a8dd);
      p_Var5 = peVar1->IFGetDeviceInfo;
      getParent(in_stack_ffffffffffffff88);
      peVar2 = std::__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<rcg::Interface,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x14a907);
      pvVar3 = Interface::getHandle(peVar2);
      pcVar4 = (char *)std::__cxx11::string::c_str();
      (*p_Var5)(pvVar3,pcVar4,9,local_14,&local_20,&local_28);
      std::shared_ptr<rcg::Interface>::~shared_ptr((shared_ptr<rcg::Interface> *)0x14a953);
    }
  }
  else {
    peVar1 = std::
             __shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
             ::operator->((__shared_ptr_access<const_rcg::GenTLWrapper,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)0x14a860);
    (*peVar1->DevGetInfo)(*(DEV_HANDLE *)(in_RDI + 0x80),9,local_14,&local_20,&local_28);
  }
  std::lock_guard<std::mutex>::~lock_guard((lock_guard<std::mutex> *)0x14a984);
  return local_20;
}

Assistant:

uint64_t Device::getTimestampFrequency()
{
  std::lock_guard<std::mutex> lock(mtx);
  GenTL::INFO_DATATYPE type;
  uint64_t freq=0;
  size_t size=sizeof(freq);

  if (dev != 0)
  {
    gentl->DevGetInfo(dev, GenTL::DEVICE_INFO_TIMESTAMP_FREQUENCY, &type, &freq, &size);
  }
  else if (parent->getHandle() != 0)
  {
    gentl->IFGetDeviceInfo(getParent()->getHandle(), id.c_str(),
                           GenTL::DEVICE_INFO_TIMESTAMP_FREQUENCY, &type, &freq, &size);
  }

  return freq;
}